

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O1

uint64_t bloaty::anon_unknown_0::ToVMAddr(uint64_t addr,uint64_t ndx,bool is_object)

{
  undefined3 in_register_00000011;
  
  if (CONCAT31(in_register_00000011,is_object) != 0) {
    if (0xffffff < ndx) {
      Throw("ndx overflow: too many sections",0x2f1);
    }
    if (addr >> 0x28 != 0) {
      Throw("address overflow: section too big",0x2f4);
    }
    addr = addr | ndx << 0x28;
  }
  return addr;
}

Assistant:

static uint64_t ToVMAddr(uint64_t addr, uint64_t ndx, bool is_object) {
  if (is_object) {
    if (ndx >= 1 << 24) {
      THROW("ndx overflow: too many sections");
    }
    if (addr >= ((uint64_t)1) << 40) {
      THROW("address overflow: section too big");
    }
    return (ndx << 40) | addr;
  } else {
    return addr;
  }
}